

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O3

void calcBias<Blob<48>,Blob<160>>
               (pfHash hash,vector<int,_std::allocator<int>_> *counts,int reps,Rand *r,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  int *piVar4;
  int iBit;
  uint32_t bit;
  undefined3 in_register_00000081;
  int iOut;
  uint32_t bit_00;
  Blob<48> K;
  Blob<160> B;
  Blob<160> A;
  undefined4 local_98;
  undefined2 local_94;
  undefined4 local_90;
  uint local_8c;
  pfHash local_88;
  ulong local_80;
  vector<int,_std::allocator<int>_> *local_78;
  Rand *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  local_90 = CONCAT31(in_register_00000081,verbose);
  uVar3 = 0;
  local_98 = 0;
  local_94 = 0;
  local_38 = 0;
  local_58 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_68 = 0;
  uStack_60 = 0;
  if (0 < reps) {
    local_80 = (ulong)(uint)reps / 10;
    local_88 = hash;
    local_78 = counts;
    local_70 = r;
    do {
      if (((char)local_90 != '\0') && (uVar3 % (uint)local_80 == 0)) {
        putchar(0x2e);
      }
      local_8c = uVar3;
      Rand::rand_p(local_70,&local_98,6);
      bit = 0;
      (*local_88)(&local_98,6,0,&local_48);
      piVar4 = (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      do {
        flipbit(&local_98,6,bit);
        (*local_88)(&local_98,6,0,&local_68);
        flipbit(&local_98,6,bit);
        bit_00 = 0;
        do {
          uVar1 = getbit(&local_48,0x14,bit_00);
          uVar2 = getbit(&local_68,0x14,bit_00);
          bit_00 = bit_00 + 1;
          *piVar4 = *piVar4 + (uVar2 ^ uVar1);
          piVar4 = piVar4 + 1;
        } while (bit_00 != 0xa0);
        bit = bit + 1;
      } while (bit != 0x30);
      uVar3 = local_8c + 1;
    } while (uVar3 != reps);
  }
  return;
}

Assistant:

void calcBias ( pfHash hash, std::vector<int> & counts, int reps, Rand & r, bool verbose )
{
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  keytype K;
  hashtype A,B;

  for(int irep = 0; irep < reps; irep++)
  {
    if(verbose) {
      if(irep % (reps/10) == 0) printf(".");
    }

    r.rand_p(&K,keybytes);

    hash(&K,keybytes,0,&A);

    int * cursor = &counts[0];

    for(int iBit = 0; iBit < keybits; iBit++)
    {
      flipbit(&K,keybytes,iBit);
      hash(&K,keybytes,0,&B);
      flipbit(&K,keybytes,iBit);

      for(int iOut = 0; iOut < hashbits; iOut++)
      {
        int bitA = getbit(&A,hashbytes,iOut);
        int bitB = getbit(&B,hashbytes,iOut);

        (*cursor++) += (bitA ^ bitB);
      }
    }
  }
}